

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O2

void ApprovalTests::FileUtils::writeToFile(string *filePath,string *content)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ofstream out;
  byte abStack_200 [480];
  
  ::std::ofstream::ofstream(&out,(filePath->_M_dataplus)._M_p,_S_out|_S_bin);
  if ((abStack_200[*(long *)(_out + -0x18)] & 5) == 0) {
    ::std::operator<<((ostream *)&out,(string *)content);
    ::std::ofstream::~ofstream(&out);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_240,"Unable to write file: ",filePath);
  ::std::runtime_error::runtime_error(this,(string *)&local_240);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void FileUtils::writeToFile(const std::string& filePath, const std::string& content)
    {
        std::ofstream out(filePath.c_str(), std::ios::binary | std::ofstream::out);
        if (!out)
        {
            throw std::runtime_error("Unable to write file: " + filePath);
        }
        out << content;
    }